

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix-top.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint err;
  uint extraout_EAX;
  helix_event_mask_t hVar2;
  helix_protocol_t proto;
  helix_session_t session;
  undefined8 uVar3;
  helix_order_book_t ob;
  helix_timestamp_t hVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  helix_event_t ev;
  ulong uVar7;
  char *pcVar8;
  size_t level;
  sockaddr_in addr;
  uv_udp_t socket;
  size_t local_140;
  char *local_138;
  char *local_130;
  ulong local_128;
  char *local_120;
  undefined1 local_118 [16];
  helix_session_t local_108 [27];
  
  program = __xpg_basename(*argv);
  local_140 = 0;
  local_138 = (char *)0x0;
  local_120 = (char *)0x0;
  local_128 = 0;
  local_130 = (char *)0x0;
  while( true ) {
    while( true ) {
      while( true ) {
        local_108[0] = (helix_session_t)((ulong)local_108[0] & 0xffffffff00000000);
        iVar1 = getopt_long(argc,argv,"s:m:P:a:p:h",trace_options,local_108);
        if (iVar1 < 0x6d) break;
        if (iVar1 == 0x6d) {
          local_140 = strtol(_optarg,(char **)0x0,10);
        }
        else if (iVar1 == 0x70) {
          local_128 = strtol(_optarg,(char **)0x0,10);
        }
        else {
          if (iVar1 != 0x73) goto LAB_0010f9f9;
          local_130 = _optarg;
        }
      }
      if (iVar1 < 0x61) break;
      if (iVar1 != 0x61) goto LAB_0010f9f9;
      local_120 = _optarg;
    }
    if (iVar1 != 0x50) break;
    local_138 = _optarg;
  }
  if (iVar1 != -1) {
LAB_0010f9f9:
    fprintf(_stdout,
            "usage: %s [options]\n  options:\n    -s, --symbol symbol          Ticker symbol to listen to.\n    -m, --max-orders number      Maximum number of orders per symbol (for pre-allocation).\n    -P, --proto proto            Market data protocol listen to.\n    -a, --multicast-addr addr    UDP multicast address to listen to.\n    -p, --multicast-port port    UDP multicast port to listen to.\n    -h, --help                   display this help and exit\n"
            ,program);
    exit(1);
  }
  if (local_130 == (char *)0x0) {
    main_cold_6();
LAB_0010fa27:
    main_cold_5();
LAB_0010fa2c:
    main_cold_4();
LAB_0010fa31:
    main_cold_3();
LAB_0010fa36:
    main_cold_2();
LAB_0010fa3e:
    main_cold_1();
    err = extraout_EAX;
  }
  else {
    if (local_138 == (char *)0x0) goto LAB_0010fa27;
    if (local_120 == (char *)0x0) goto LAB_0010fa2c;
    if ((int)local_128 == 0) goto LAB_0010fa31;
    proto = helix_protocol_lookup(local_138);
    if (proto == (helix_protocol_t)0x0) goto LAB_0010fa36;
    session = helix_session_create(proto,process_event,(void *)0x0);
    if (session == (helix_session_t)0x0) goto LAB_0010fa3e;
    helix_session_subscribe(session,local_130,local_140);
    uVar3 = uv_default_loop();
    err = uv_udp_init(uVar3,local_108);
    if (err == 0) {
      local_108[0] = session;
      err = uv_ip4_addr("0.0.0.0",local_128 & 0xffffffff,local_118);
      if (err == 0) {
        err = uv_udp_bind(local_108,local_118,4);
        if (err == 0) {
          err = uv_udp_set_membership(local_108,local_120,0,1);
          if (err == 0) {
            err = uv_udp_recv_start(local_108,alloc_packet,recv_packet);
            if (err == 0) {
              initscr();
              wclear(_stdscr);
              wrefresh(_stdscr);
              uVar3 = uv_default_loop();
              uv_run(uVar3,0);
              endwin();
              return 0;
            }
            pcVar8 = "uv_udp_recv_start";
          }
          else {
            pcVar8 = "uv_udp_set_membership";
          }
        }
        else {
          pcVar8 = "uv_udp_bind";
        }
      }
      else {
        pcVar8 = "uv_ip4_addr";
      }
      goto LAB_0010fa6e;
    }
  }
  pcVar8 = "uv_udp_init";
LAB_0010fa6e:
  ev = (helix_event_t)(ulong)err;
  libuv_error(pcVar8,err);
  hVar2 = helix_event_mask(ev);
  if ((hVar2 & HELIX_EVENT_ORDER_BOOK_UPDATE) != 0) {
    ob = helix_event_order_book(ev);
    hVar4 = helix_order_book_timestamp(ob);
    hVar2 = helix_order_book_state(ob);
    if (hVar2 == HELIX_EVENT_SWEEP) {
      uVar7 = (hVar4 / 3600000) * -0xe10 + hVar4 / 1000;
      werase(_stdscr);
      wmove(_stdscr,0,0);
      pcVar8 = helix_event_symbol(ev);
      printw("%16s    %02lu:%02lu:%02lu.%03lu\n",pcVar8,hVar4 / 3600000,uVar7 / 0x3c,uVar7 % 0x3c,
             hVar4 % 1000);
      level = 0;
      do {
        uVar7 = level + 1;
        wmove(_stdscr,uVar7 & 0xffffffff,0);
        uVar5 = helix_order_book_bid_size(ob,level);
        helix_order_book_bid_price(ob,level);
        helix_order_book_ask_price(ob,level);
        uVar6 = helix_order_book_ask_size(ob,level);
        printw("| %6lu  %.3f  %.3f  %-6lu |\n",uVar5,uVar6);
        level = uVar7;
      } while (uVar7 != 5);
      iVar1 = wrefresh(_stdscr);
      return iVar1;
    }
  }
  return hVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	helix_session_t session;
	struct sockaddr_in addr;
	helix_protocol_t proto;
	struct config cfg = {};
	uv_udp_t socket;
	int err;

	program = basename(argv[0]);

	parse_options(&cfg, argc, argv);

	if (!cfg.symbol) {
		fprintf(stderr, "error: symbol is not specified. Use the '-s' option to specify it.\n");
		exit(1);
	}

	if (!cfg.proto) {
		fprintf(stderr, "error: multicast protocol is not specified. Use the '-P' option to specify it.\n");
		exit(1);
	}

	if (!cfg.multicast_addr) {
		fprintf(stderr, "error: multicast address is not specified. Use the '-a' option to specify it.\n");
		exit(1);
	}

	if (!cfg.multicast_port) {
		fprintf(stderr, "error: multicast port is not specified. Use the '-p' option to specify it.\n");
		exit(1);
	}

	proto = helix_protocol_lookup(cfg.proto);
	if (!proto) {
		fprintf(stderr, "error: protocol '%s' is not supported\n", cfg.proto);
		exit(1);
	}

	session = helix_session_create(proto, process_event, NULL);
	if (!session) {
		fprintf(stderr, "error: unable to create new session\n");
		exit(1);
	}

	helix_session_subscribe(session, cfg.symbol, cfg.max_orders);

	err = uv_udp_init(uv_default_loop(), &socket);
	if (err) {
		libuv_error("uv_udp_init", err);
	}
	socket.data = session;

	err = uv_ip4_addr("0.0.0.0", cfg.multicast_port, &addr);
	if (err) {
		libuv_error("uv_ip4_addr", err);
	}

	err = uv_udp_bind(&socket, (const struct sockaddr *)&addr, UV_UDP_REUSEADDR);
	if (err) {
		libuv_error("uv_udp_bind", err);
	}

	err = uv_udp_set_membership(&socket, cfg.multicast_addr, NULL, UV_JOIN_GROUP);
	if (err) {
		libuv_error("uv_udp_set_membership", err);
	}

	err = uv_udp_recv_start(&socket, alloc_packet, recv_packet);
	if (err) {
		libuv_error("uv_udp_recv_start", err);
	}

	initscr();

	clear();

	refresh();

	uv_run(uv_default_loop(), UV_RUN_DEFAULT);

	endwin();

	return 0;
}